

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclDeptFanin(SC_Man *p,SC_Timing *pTime,Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  SC_Pair *pSVar4;
  SC_Pair *pSVar5;
  SC_Pair *pSVar6;
  SC_TSense SVar7;
  float fVar8;
  float fVar9;
  
  pSVar4 = p->pLoads;
  pSVar5 = p->pDepts;
  uVar2 = pFanin->Id;
  pSVar6 = p->pSlews;
  uVar3 = pObj->Id;
  SVar7 = pTime->tsense;
  if ((SVar7 | sc_ts_Neg) == sc_ts_Non) {
    fVar9 = pSVar5[uVar2].rise;
    fVar1 = pSVar5[uVar3].rise;
    fVar8 = Scl_LibLookup(&pTime->pCellRise,pSVar6[uVar2].rise,pSVar4[uVar3].rise);
    fVar8 = fVar8 + fVar1;
    if (fVar9 <= fVar8) {
      fVar9 = fVar8;
    }
    pSVar5[uVar2].rise = fVar9;
    fVar9 = pSVar5[uVar2].fall;
    fVar1 = pSVar5[uVar3].fall;
    fVar8 = Scl_LibLookup(&pTime->pCellFall,pSVar6[uVar2].fall,pSVar4[uVar3].fall);
    fVar8 = fVar8 + fVar1;
    if (fVar9 <= fVar8) {
      fVar9 = fVar8;
    }
    pSVar5[uVar2].fall = fVar9;
    SVar7 = pTime->tsense;
  }
  if ((SVar7 & ~sc_ts_Pos) == sc_ts_Neg) {
    fVar9 = pSVar5[uVar2].fall;
    fVar1 = pSVar5[uVar3].rise;
    fVar8 = Scl_LibLookup(&pTime->pCellRise,pSVar6[uVar2].fall,pSVar4[uVar3].rise);
    fVar8 = fVar8 + fVar1;
    if (fVar9 <= fVar8) {
      fVar9 = fVar8;
    }
    pSVar5[uVar2].fall = fVar9;
    fVar9 = pSVar5[uVar2].rise;
    fVar1 = pSVar5[uVar3].fall;
    fVar8 = Scl_LibLookup(&pTime->pCellFall,pSVar6[uVar2].rise,pSVar4[uVar3].fall);
    fVar8 = fVar8 + fVar1;
    if (fVar9 <= fVar8) {
      fVar9 = fVar8;
    }
    pSVar5[uVar2].rise = fVar9;
  }
  return;
}

Assistant:

static inline void Abc_SclDeptFanin( SC_Man * p, SC_Timing * pTime, Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    SC_Pair * pDepIn   = Abc_SclObjDept( p, pFanin );   // modified
    SC_Pair * pSlewIn  = Abc_SclObjSlew( p, pFanin );
    SC_Pair * pLoad    = Abc_SclObjLoad( p, pObj );
    SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
    Scl_LibPinDeparture( pTime, pDepIn, pSlewIn, pLoad, pDepOut );
}